

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagate_filter.cpp
# Opt level: O1

void __thiscall
duckdb::StatisticsPropagator::UpdateFilterStatistics
          (StatisticsPropagator *this,BaseStatistics *stats,ExpressionType comparison_type,
          Value *constant)

{
  bool bVar1;
  undefined3 in_register_00000011;
  
  if ((CONCAT31(in_register_00000011,comparison_type) != 0x25) &&
     (CONCAT31(in_register_00000011,comparison_type) != 0x28)) {
    BaseStatistics::Set(stats,CANNOT_HAVE_NULL_VALUES);
  }
  bVar1 = LogicalType::IsNumeric(&stats->type);
  if ((bVar1) && (bVar1 = NumericStats::HasMinMax(stats), bVar1)) {
    switch(comparison_type) {
    case COMPARE_BOUNDARY_START:
      NumericStats::SetMin(stats,constant);
    case COMPARE_LESSTHAN:
    case COMPARE_LESSTHANOREQUALTO:
      NumericStats::SetMax(stats,constant);
      return;
    case COMPARE_GREATERTHAN:
    case COMPARE_GREATERTHANOREQUALTO:
      NumericStats::SetMin(stats,constant);
      return;
    }
  }
  return;
}

Assistant:

void StatisticsPropagator::UpdateFilterStatistics(BaseStatistics &stats, ExpressionType comparison_type,
                                                  const Value &constant) {
	// regular comparisons removes all null values
	if (!IsCompareDistinct(comparison_type)) {
		stats.Set(StatsInfo::CANNOT_HAVE_NULL_VALUES);
	}
	if (!stats.GetType().IsNumeric()) {
		// don't handle non-numeric columns here (yet)
		return;
	}
	if (!NumericStats::HasMinMax(stats)) {
		// no stats available: skip this
		return;
	}
	switch (comparison_type) {
	case ExpressionType::COMPARE_LESSTHAN:
	case ExpressionType::COMPARE_LESSTHANOREQUALTO:
		// X < constant OR X <= constant
		// max becomes the constant
		NumericStats::SetMax(stats, constant);
		break;
	case ExpressionType::COMPARE_GREATERTHAN:
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
		// X > constant OR X >= constant
		// min becomes the constant
		NumericStats::SetMin(stats, constant);
		break;
	case ExpressionType::COMPARE_EQUAL:
		// X = constant
		// both min and max become the constant
		NumericStats::SetMin(stats, constant);
		NumericStats::SetMax(stats, constant);
		break;
	default:
		break;
	}
}